

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void iterator_suite::test_iterator_constructible(void)

{
  bool bVar1;
  iterator bravo;
  array<int,_4UL> array;
  iterator local_68;
  iterator local_58;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0xb);
  local_58 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bravo = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_58,&bravo);
  boost::detail::test_impl
            ("alpha == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x282,"void iterator_suite::test_iterator_constructible()",bVar1);
  bravo = local_58;
  local_68 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&bravo,&local_68);
  boost::detail::test_impl
            ("bravo == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x284,"void iterator_suite::test_iterator_constructible()",bVar1);
  return;
}

Assistant:

void test_iterator_constructible()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    decltype(span)::iterator alpha; // DefaultConstructible
    alpha = span.begin();
    BOOST_TEST(alpha == span.begin());
    decltype(span)::iterator bravo(alpha); // CopyConstructible
    BOOST_TEST(bravo == span.begin());
}